

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity
          (Vector<capnp::_::RawBrandedSchema::Dependency> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> newBuilder;
  size_t newSize_local;
  Vector<capnp::_::RawBrandedSchema::Dependency> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<capnp::_::RawBrandedSchema::Dependency>
            ((ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *)local_38,
             (size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>>(&this->builder);
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::
  addAll<kj::ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>>
            ((ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>>
                     ((ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *)local_38);
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::operator=(&this->builder,pAVar2);
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::~ArrayBuilder
            ((ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }